

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

int io_popen(lua_State *L)

{
  int iVar1;
  char *__command;
  char *__modes;
  undefined8 *puVar2;
  int *piVar3;
  FILE *pFVar4;
  
  __command = luaL_checklstring(L,1,(size_t *)0x0);
  __modes = luaL_optlstring(L,2,"r",(size_t *)0x0);
  puVar2 = (undefined8 *)lua_newuserdatauv(L,0x10,0);
  puVar2[1] = 0;
  luaL_setmetatable(L,"FILE*");
  if (((*__modes != 'w') && (*__modes != 'r')) || (__modes[1] != '\0')) {
    luaL_argerror(L,2,"invalid mode");
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  fflush((FILE *)0x0);
  pFVar4 = popen(__command,__modes);
  *puVar2 = pFVar4;
  puVar2[1] = io_pclose;
  if (pFVar4 != (FILE *)0x0) {
    return 1;
  }
  iVar1 = luaL_fileresult(L,0,__command);
  return iVar1;
}

Assistant:

static int io_popen (lua_State *L) {
  const char *filename = luaL_checkstring(L, 1);
  const char *mode = luaL_optstring(L, 2, "r");
  LStream *p = newprefile(L);
  luaL_argcheck(L, l_checkmodep(mode), 2, "invalid mode");
  errno = 0;
  p->f = l_popen(L, filename, mode);
  p->closef = &io_pclose;
  return (p->f == NULL) ? luaL_fileresult(L, 0, filename) : 1;
}